

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::UnpackHalf2x16CaseInstance::~UnpackHalf2x16CaseInstance
          (UnpackHalf2x16CaseInstance *this)

{
  UnpackHalf2x16CaseInstance *this_local;
  
  ~UnpackHalf2x16CaseInstance(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

UnpackHalf2x16CaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
	: ShaderPackingFunctionTestInstance (context, shaderType, spec, name)
	{
	}